

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

size_t Output::PrintBuffer(char16 *buf,size_t size)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  char16_t *pcVar4;
  ulong *puVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  size_t count;
  ulong *puVar9;
  char16_t *pcVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  size_t count_00;
  long lVar14;
  char16 *dst;
  ulong local_40;
  size_t local_38;
  
  pcVar3 = (char *)__tls_get_addr(&PTR_0155fcc8);
  if ((*pcVar3 == '\x01') &&
     ((pcVar3 = (char *)__tls_get_addr(&PTR_0155fc98), *pcVar3 != '\x01' ||
      (pcVar4 = PAL_wcschr(buf,L'\n'), pcVar4 != (char16_t *)0x0)))) {
    puVar5 = (ulong *)__tls_get_addr(&PTR_0155fc78);
    local_38 = *puVar5 + size;
    pcVar6 = (char16 *)calloc(local_38,2);
    if (pcVar6 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0x12e,"(newbuf != nullptr)","Ran out of memory while printing output");
      if (!bVar2) goto LAB_003657eb;
      *puVar7 = 0;
    }
    puVar8 = (undefined8 *)__tls_get_addr(&PTR_0155fb58);
    count = PAL_wcslen((char16_t *)*puVar8);
    pcVar4 = buf + size;
    dst = pcVar6;
    if (buf < pcVar4) {
      puVar9 = (ulong *)__tls_get_addr(&PTR_0155fb78);
      local_40 = *puVar9;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (*pcVar3 == '\0') {
          uVar12 = (int)*puVar5 - (int)local_40;
          if (*puVar5 <= local_40) {
            uVar12 = 1;
          }
          uVar13 = (ulong)uVar12;
          lVar14 = (long)dst - (long)pcVar6;
          if (local_38 - (lVar14 >> 1) <= uVar13) {
            pcVar6 = (char16 *)realloc(pcVar6,local_38 * 4);
            if (pcVar6 == (char16 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                                 ,0x139,"(tempbuf != nullptr)",
                                 "Ran out of memory while printing output");
              if (!bVar2) goto LAB_003657eb;
              *puVar7 = 0;
            }
            local_38 = local_38 * 2;
            dst = (char16 *)(lVar14 + (long)pcVar6);
          }
          while (uVar12 != 0) {
            *dst = L' ';
            dst = dst + 1;
            uVar12 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar12;
          }
          lVar14 = (long)dst - (long)pcVar6;
          if (local_38 - (lVar14 >> 1) < count + 1) {
            pcVar6 = (char16 *)realloc(pcVar6,local_38 * 4);
            if (pcVar6 == (char16 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                                 ,0x139,"(tempbuf != nullptr)",
                                 "Ran out of memory while printing output");
              if (!bVar2) goto LAB_003657eb;
              *puVar7 = 0;
            }
            local_38 = local_38 * 2;
            dst = (char16 *)(lVar14 + (long)pcVar6);
          }
          js_wmemcpy_s(dst,(long)((long)pcVar6 + (local_38 * 2 - (long)dst)) >> 1,(char16 *)*puVar8,
                       count);
          dst = dst + count;
          local_40 = *puVar5 + count;
          *pcVar3 = '\x01';
        }
        pcVar10 = PAL_wcschr(buf,L'\n');
        if (pcVar10 == (char16_t *)0x0) {
          count_00 = (long)pcVar4 - (long)buf >> 1;
          local_40 = local_40 + count_00;
        }
        else {
          count_00 = ((long)pcVar10 - (long)buf >> 1) + 1;
          *pcVar3 = '\0';
          local_40 = 0;
        }
        lVar14 = (long)dst - (long)pcVar6;
        if (local_38 - (lVar14 >> 1) < ((long)pcVar10 - (long)buf >> 1) + 1U) {
          pcVar6 = (char16 *)realloc(pcVar6,local_38 * 4);
          if (pcVar6 == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                               ,0x139,"(tempbuf != nullptr)",
                               "Ran out of memory while printing output");
            if (!bVar2) goto LAB_003657eb;
            *puVar7 = 0;
          }
          local_38 = local_38 * 2;
          dst = (char16 *)(lVar14 + (long)pcVar6);
        }
        js_wmemcpy_s(dst,(long)((long)pcVar6 + (local_38 * 2 - (long)dst)) >> 1,buf,count_00);
        buf = buf + count_00;
        dst = dst + count_00;
      } while (buf < pcVar4);
    }
    buf = pcVar6;
    if (local_38 - ((long)dst - (long)pcVar6 >> 1) < 2) {
      buf = (char16 *)realloc(pcVar6,local_38 << 2);
      if (buf == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                           ,0x139,"(tempbuf != nullptr)","Ran out of memory while printing output");
        if (!bVar2) {
LAB_003657eb:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      dst = (char16 *)(((long)dst - (long)pcVar6) + (long)buf);
    }
    *dst = L'\0';
    size = ((long)dst + (2 - (long)buf) >> 1) - 1;
  }
  plVar11 = (long *)__tls_get_addr(&PTR_0155fb78);
  *plVar11 = *plVar11 + size;
  pcVar6 = buf;
  while (pcVar4 = PAL_wcschr(pcVar6,L'\n'), pcVar4 != (char16_t *)0x0) {
    *plVar11 = ~((long)pcVar4 - (long)buf >> 1) + size;
    pcVar6 = pcVar4 + 1;
  }
  pcVar3 = (char *)__tls_get_addr(&PTR_0155fa60);
  bVar2 = s_useDebuggerWindow;
  if (*pcVar3 == '\0') {
    if (s_useDebuggerWindow == true) {
      OutputDebugStringW(buf);
    }
    if (s_inMemoryLogger != (ILogger *)0x0) {
      (**s_inMemoryLogger->_vptr_ILogger)(s_inMemoryLogger,buf);
      goto LAB_003657d4;
    }
    if (bVar2 != false) goto LAB_003657d4;
  }
  puVar8 = (undefined8 *)__tls_get_addr(&PTR_0155f778);
  if (((PAL_FILE *)*puVar8 == (PAL_FILE *)0x0) || (*pcVar3 == '\x01')) {
    DirectPrint(buf);
  }
  else {
    PAL_fwprintf((PAL_FILE *)*puVar8,L"%s",buf);
  }
  if ((s_outputFile.super_BasePtr<_PAL_FILE>.ptr != (_PAL_FILE *)0x0) && (*pcVar3 == '\0')) {
    PAL_fwprintf((PAL_FILE *)s_outputFile.super_BasePtr<_PAL_FILE>.ptr,L"%s",buf);
  }
LAB_003657d4:
  Flush();
  return size;
}

Assistant:

size_t __cdecl
Output::PrintBuffer(const char16 * buf, size_t size)
{
    // Handle custom line prefixing
    bool internallyAllocatedBuffer = false;
    if (usingCustomAlignAndPrefix)
    {
        if (hasDoneAlignPrefixForThisLine && wcschr(buf, '\n') == nullptr)
        {
            // no newlines, and we've already prefixed this line, so nothing to do
        }
        else
        {
            size_t newbufsize = size + align;
            char16* newbuf = (char16*)calloc(newbufsize, sizeof(char16));
            AssertOrFailFastMsg(newbuf != nullptr, "Ran out of memory while printing output");
            internallyAllocatedBuffer = true;
            const char16* currentReadIndex = buf;
            char16* currentWriteIndex = newbuf;
            auto ensureSpace = [&currentWriteIndex, &newbuf, &newbufsize](size_t numCharsWantToWrite)
            {
                size_t charsWritten = (currentWriteIndex - newbuf); // pointer subtraction is number of elements of pointed type between pointers
                size_t remaining = newbufsize - charsWritten;
                if (numCharsWantToWrite + 1 > remaining)
                {
                    char16* tempbuf = (char16*)realloc(newbuf, newbufsize * sizeof(char16) * 2);
                    AssertOrFailFastMsg(tempbuf != nullptr, "Ran out of memory while printing output");
                    newbuf = tempbuf;
                    newbufsize = newbufsize * 2;
                    currentWriteIndex = newbuf + charsWritten;
                }
            };
            const size_t prefixlength = wcslen(prefix);
            size_t oldS_Column = Output::s_Column;
            while (currentReadIndex < buf + size)
            {
                if (!hasDoneAlignPrefixForThisLine)
                {
                    // attempt to write the alignment
                    {
                        unsigned int alignspacesneeded = 1; // always put at least one space
                        if (oldS_Column < align)
                        {
                            alignspacesneeded = (unsigned int)(align - oldS_Column);
                        }
                        ensureSpace(alignspacesneeded);
                        for (unsigned int i = 0; i < alignspacesneeded; i++)
                        {
                            *(currentWriteIndex++) = ' ';
                        }
                    }
                    // attempt to write the prefix
                    ensureSpace(prefixlength);
                    js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, Output::prefix, prefixlength);
                    currentWriteIndex += prefixlength;
                    oldS_Column = align + prefixlength;
                    hasDoneAlignPrefixForThisLine = true;
                }
                const char16* endOfLine = wcschr(currentReadIndex, '\n');
                size_t charsToCopy = 0;
                if (endOfLine != nullptr)
                {
                    charsToCopy = (endOfLine - currentReadIndex) + 1; // We want to grab the newline character as part of this line
                    oldS_Column = 0; // We're ending this line, and want the next to be calculated properly
                    hasDoneAlignPrefixForThisLine = false; // The next line will need this
                }
                else
                {
                    charsToCopy = (buf + size) - currentReadIndex; // the rest of the input buffer
                    oldS_Column += charsToCopy; // Will be reset anyway later on
                }
                ensureSpace(endOfLine - currentReadIndex);
                js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, currentReadIndex, charsToCopy);
                currentReadIndex += charsToCopy;
                currentWriteIndex += charsToCopy;
            }
            // null terminate becuase there's no real reason not to
            ensureSpace(1);
            *(currentWriteIndex++) = '\0';
            buf = newbuf;
            size = (currentWriteIndex - newbuf) - 1; // not counting the terminator here though, to align with vsnwprintf_s's behavior
        }
    }
    Output::s_Column += size;
    const char16 * endbuf = wcschr(buf, '\n');
    while (endbuf != nullptr)
    {
        Output::s_Column = size - (endbuf - buf) - 1;
        endbuf = wcschr(endbuf + 1, '\n');
    }

    bool useConsoleOrFile = true;
    if (!Output::s_capture)
    {
        if (Output::s_useDebuggerWindow)
        {
            OutputDebugStringW(buf);
            useConsoleOrFile = false;
        }
#ifdef ENABLE_TRACE
        if (Output::s_inMemoryLogger)
        {
            s_inMemoryLogger->Write(buf);
            useConsoleOrFile = false;
        }
#endif
    }

    if (useConsoleOrFile)
    {
        if (s_file == nullptr || Output::s_capture)
        {
#ifdef _WIN32
            bool addToBuffer = true;
            if (Output::bufferFreeSize < size + 1)
            {
                if (Output::bufferAllocSize > MAX_OUTPUT_BUFFER_SIZE && !Output::s_capture)
                {
                    Output::Flush();
                    if (Output::bufferFreeSize < size + 1)
                    {
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                }
                else
                {
                    size_t oldBufferSize = bufferAllocSize - bufferFreeSize;
                    size_t newBufferAllocSize = (bufferAllocSize + size + 1) * 4 / 3;
                    char16 * newBuffer = (char16 *)realloc(buffer, (newBufferAllocSize * sizeof(char16)));
                    if (newBuffer == nullptr)
                    {
                        // See if I can just flush it and print directly
                        Output::Flush();

                        // Reset the buffer
                        free(Output::buffer);
                        Output::buffer = nullptr;
                        Output::bufferAllocSize = 0;
                        Output::bufferFreeSize = 0;

                        // Print it directly
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                    else
                    {
                        bufferAllocSize = newBufferAllocSize;
                        buffer = newBuffer;
                        bufferFreeSize = bufferAllocSize - oldBufferSize;
                    }
                }
            }
            if (addToBuffer)
            {
                Assert(Output::bufferFreeSize >= size + 1);
                memcpy_s(Output::buffer + Output::bufferAllocSize - Output::bufferFreeSize, Output::bufferFreeSize * sizeof(char16),
                    buf, size * sizeof(char16));
                bufferFreeSize -= size;
                Output::buffer[Output::bufferAllocSize - Output::bufferFreeSize] = _u('\0');  // null terminate explicitly
            }
#else
            DirectPrint(buf);
#endif
        }
        else
        {
            fwprintf_s(Output::s_file, _u("%s"), buf);
        }

        if(s_outputFile != nullptr && !Output::s_capture)
        {
            fwprintf_s(s_outputFile, _u("%s"), buf);
        }
    }

    Output::Flush();

    return size;
}